

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::InstanceArrayIntersectorK<8>_>,_false>
     ::occludedCoherent(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  ulong *puVar1;
  ulong *puVar2;
  undefined1 auVar3 [32];
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 aVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  uint uVar14;
  undefined4 uVar15;
  vbool<8> *pvVar16;
  ulong *puVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  NodeRef nodeRef;
  ulong uVar25;
  Primitive_conflict4 *prim;
  bool bVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [64];
  vint4 ai_1;
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  vint4 ai;
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 in_ZMM11 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  Precalculations pre;
  vint8 bi_1;
  vbool<8> valid0;
  StackItemMaskT<embree::NodeRefPtr<4>_> stack [244];
  Precalculations local_1371;
  vbool<8> *local_1370;
  RayK<8> *local_1368;
  AccelData *local_1360;
  ulong local_1358;
  ulong local_1350;
  RayK<8> *local_1348;
  RayQueryContext *local_1340;
  vbool<8> *local_1338;
  ulong local_1330;
  ulong local_1328;
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [16];
  uint uStack_12b0;
  uint uStack_12ac;
  uint uStack_12a8;
  uint uStack_12a4;
  uint local_1290;
  uint uStack_128c;
  uint uStack_1288;
  uint uStack_1284;
  undefined4 local_1280;
  undefined4 uStack_127c;
  undefined4 uStack_1278;
  undefined4 uStack_1274;
  undefined4 local_1270;
  undefined4 uStack_126c;
  undefined4 uStack_1268;
  undefined4 uStack_1264;
  undefined1 local_1260 [16];
  undefined1 local_1250 [16];
  undefined1 local_1240 [16];
  undefined1 local_1230 [16];
  uint local_1220;
  uint uStack_121c;
  uint uStack_1218;
  uint uStack_1214;
  float local_1210;
  float fStack_120c;
  float fStack_1208;
  float fStack_1204;
  uint local_1200;
  uint uStack_11fc;
  uint uStack_11f8;
  uint uStack_11f4;
  undefined1 local_11f0 [16];
  undefined1 local_11e0 [16];
  undefined1 local_11d0 [16];
  uint local_11c0;
  uint uStack_11bc;
  uint uStack_11b8;
  uint uStack_11b4;
  float local_11b0;
  float fStack_11ac;
  float fStack_11a8;
  float fStack_11a4;
  undefined1 local_11a0 [32];
  float local_1180;
  float fStack_117c;
  float fStack_1178;
  float fStack_1174;
  float fStack_1170;
  float fStack_116c;
  float fStack_1168;
  undefined4 uStack_1164;
  float local_1160;
  float fStack_115c;
  float fStack_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  float fStack_1148;
  undefined4 uStack_1144;
  float local_1140;
  float fStack_113c;
  float fStack_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  float fStack_1128;
  undefined4 uStack_1124;
  undefined1 local_1120 [32];
  anon_union_32_3_898e2e57_for_vint_impl<8>_1 local_1100;
  undefined4 local_10e0;
  undefined4 uStack_10dc;
  undefined4 uStack_10d8;
  undefined4 uStack_10d4;
  undefined4 uStack_10d0;
  undefined4 uStack_10cc;
  undefined4 uStack_10c8;
  undefined4 uStack_10c4;
  undefined1 local_10c0 [32];
  float local_10a0;
  float fStack_109c;
  float fStack_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float fStack_1088;
  undefined4 uStack_1084;
  float local_1080;
  float fStack_107c;
  float fStack_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float fStack_1068;
  undefined4 uStack_1064;
  float local_1060;
  float fStack_105c;
  float fStack_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float fStack_1048;
  undefined4 uStack_1044;
  undefined1 local_1040 [32];
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  undefined1 local_fe0 [32];
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 local_fc0;
  ulong local_fa0;
  vbool<8> *local_f98;
  ulong local_f90 [492];
  
  auVar28 = vpcmpeqd_avx2(in_ZMM11._0_32_,in_ZMM11._0_32_);
  auVar53 = ZEXT3264(auVar28);
  auVar27 = vpcmpeqd_avx2(auVar28,(undefined1  [32])valid_i->field_0);
  uVar14 = vmovmskps_avx(auVar27);
  if (uVar14 == 0) {
    return;
  }
  local_1100.v = valid_i->field_0;
  local_1360 = This->ptr;
  local_1358 = (ulong)(uVar14 & 0xff);
  uStack_1124 = *(undefined4 *)(ray + 0x1c);
  uStack_1144 = *(undefined4 *)(ray + 0x3c);
  auVar3 = *(undefined1 (*) [32])(ray + 0x80);
  auVar42._8_4_ = 0x7fffffff;
  auVar42._0_8_ = 0x7fffffff7fffffff;
  auVar42._12_4_ = 0x7fffffff;
  auVar42._16_4_ = 0x7fffffff;
  auVar42._20_4_ = 0x7fffffff;
  auVar42._24_4_ = 0x7fffffff;
  auVar42._28_4_ = 0x7fffffff;
  auVar46._8_4_ = 0x219392ef;
  auVar46._0_8_ = 0x219392ef219392ef;
  auVar46._12_4_ = 0x219392ef;
  auVar46._16_4_ = 0x219392ef;
  auVar46._20_4_ = 0x219392ef;
  auVar46._24_4_ = 0x219392ef;
  auVar46._28_4_ = 0x219392ef;
  auVar30 = vandps_avx(auVar3,auVar42);
  auVar30 = vcmpps_avx(auVar30,auVar46,1);
  auVar37 = vblendvps_avx(auVar3,auVar46,auVar30);
  uStack_1164 = *(undefined4 *)(ray + 0x5c);
  auVar30 = *(undefined1 (*) [32])(ray + 0xa0);
  auVar38 = vandps_avx(auVar30,auVar42);
  auVar38 = vcmpps_avx(auVar38,auVar46,1);
  auVar44 = vblendvps_avx(auVar30,auVar46,auVar38);
  auVar38 = *(undefined1 (*) [32])(ray + 0xc0);
  auVar33 = vandps_avx(auVar38,auVar42);
  auVar33 = vcmpps_avx(auVar33,auVar46,1);
  auVar42 = vrcpps_avx(auVar37);
  auVar33 = vblendvps_avx(auVar38,auVar46,auVar33);
  auVar43._8_4_ = 0x3f800000;
  auVar43._0_8_ = 0x3f8000003f800000;
  auVar43._12_4_ = 0x3f800000;
  auVar43._16_4_ = 0x3f800000;
  auVar43._20_4_ = 0x3f800000;
  auVar43._24_4_ = 0x3f800000;
  auVar43._28_4_ = 0x3f800000;
  auVar46 = vrcpps_avx(auVar44);
  auVar9 = vfnmadd213ps_fma(auVar37,auVar42,auVar43);
  auVar9 = vfmadd132ps_fma(ZEXT1632(auVar9),auVar42,auVar42);
  auVar54 = ZEXT1664(auVar9);
  auVar10 = vfnmadd213ps_fma(auVar44,auVar46,auVar43);
  auVar10 = vfmadd132ps_fma(ZEXT1632(auVar10),auVar46,auVar46);
  auVar55 = ZEXT1664(auVar10);
  auVar37 = vrcpps_avx(auVar33);
  auVar11 = vfnmadd213ps_fma(auVar33,auVar37,auVar43);
  auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar37,auVar37);
  auVar56 = ZEXT1664(auVar11);
  auVar33 = ZEXT1232(ZEXT812(0)) << 0x20;
  local_11a0 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar33);
  local_1368 = ray + 0x100;
  local_10c0 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar33);
  auVar57 = ZEXT3264(auVar28 ^ auVar27);
  auVar44 = ZEXT1232(ZEXT812(0)) << 0x20;
  auVar3 = vcmpps_avx(auVar3,auVar44,1);
  auVar33._8_4_ = 1;
  auVar33._0_8_ = 0x100000001;
  auVar33._12_4_ = 1;
  auVar33._16_4_ = 1;
  auVar33._20_4_ = 1;
  auVar33._24_4_ = 1;
  auVar33._28_4_ = 1;
  auVar3 = vandps_avx(auVar3,auVar33);
  auVar30 = vcmpps_avx(auVar30,auVar44,1);
  auVar37._8_4_ = 2;
  auVar37._0_8_ = 0x200000002;
  auVar37._12_4_ = 2;
  auVar37._16_4_ = 2;
  auVar37._20_4_ = 2;
  auVar37._24_4_ = 2;
  auVar37._28_4_ = 2;
  auVar30 = vandps_avx(auVar30,auVar37);
  auVar30 = vorps_avx(auVar30,auVar3);
  auVar3 = vcmpps_avx(auVar38,auVar44,1);
  auVar38._8_4_ = 4;
  auVar38._0_8_ = 0x400000004;
  auVar38._12_4_ = 4;
  auVar38._16_4_ = 4;
  auVar38._20_4_ = 4;
  auVar38._24_4_ = 4;
  auVar38._28_4_ = 4;
  auVar3 = vandps_avx(auVar3,auVar38);
  auVar28 = vpor_avx2(auVar28 ^ auVar27,auVar3);
  local_1120 = vpor_avx2(auVar28,auVar30);
  local_1060 = *(float *)ray;
  fStack_105c = *(float *)(ray + 4);
  fStack_1058 = *(float *)(ray + 8);
  fStack_1054 = *(float *)(ray + 0xc);
  fStack_1050 = *(float *)(ray + 0x10);
  fStack_104c = *(float *)(ray + 0x14);
  fStack_1048 = *(float *)(ray + 0x18);
  uStack_1044 = uStack_1124;
  local_1140 = auVar9._0_4_ * -*(float *)ray;
  fStack_113c = auVar9._4_4_ * -*(float *)(ray + 4);
  fStack_1138 = auVar9._8_4_ * -*(float *)(ray + 8);
  fStack_1134 = auVar9._12_4_ * -*(float *)(ray + 0xc);
  fStack_1130 = -*(float *)(ray + 0x10) * 0.0;
  fStack_112c = -*(float *)(ray + 0x14) * 0.0;
  fStack_1128 = -*(float *)(ray + 0x18) * 0.0;
  local_1080 = *(float *)(ray + 0x20);
  fStack_107c = *(float *)(ray + 0x24);
  fStack_1078 = *(float *)(ray + 0x28);
  fStack_1074 = *(float *)(ray + 0x2c);
  fStack_1070 = *(float *)(ray + 0x30);
  fStack_106c = *(float *)(ray + 0x34);
  fStack_1068 = *(float *)(ray + 0x38);
  uStack_1064 = uStack_1144;
  local_1160 = auVar10._0_4_ * -*(float *)(ray + 0x20);
  fStack_115c = auVar10._4_4_ * -*(float *)(ray + 0x24);
  fStack_1158 = auVar10._8_4_ * -*(float *)(ray + 0x28);
  fStack_1154 = auVar10._12_4_ * -*(float *)(ray + 0x2c);
  fStack_1150 = -*(float *)(ray + 0x30) * 0.0;
  fStack_114c = -*(float *)(ray + 0x34) * 0.0;
  fStack_1148 = -*(float *)(ray + 0x38) * 0.0;
  local_10a0 = *(float *)(ray + 0x40);
  fStack_109c = *(float *)(ray + 0x44);
  fStack_1098 = *(float *)(ray + 0x48);
  fStack_1094 = *(float *)(ray + 0x4c);
  fStack_1090 = *(float *)(ray + 0x50);
  fStack_108c = *(float *)(ray + 0x54);
  fStack_1088 = *(float *)(ray + 0x58);
  uStack_1084 = uStack_1164;
  local_1180 = auVar11._0_4_ * -*(float *)(ray + 0x40);
  fStack_117c = auVar11._4_4_ * -*(float *)(ray + 0x44);
  fStack_1178 = auVar11._8_4_ * -*(float *)(ray + 0x48);
  fStack_1174 = auVar11._12_4_ * -*(float *)(ray + 0x4c);
  fStack_1170 = -*(float *)(ray + 0x50) * 0.0;
  fStack_116c = -*(float *)(ray + 0x54) * 0.0;
  fStack_1168 = -*(float *)(ray + 0x58) * 0.0;
  local_1290 = 0x80000000;
  uStack_128c = 0x80000000;
  uStack_1288 = 0x80000000;
  uStack_1284 = 0x80000000;
  local_10e0 = 0x7f800000;
  uStack_10dc = 0x7f800000;
  uStack_10d8 = 0x7f800000;
  uStack_10d4 = 0x7f800000;
  uStack_10d0 = 0x7f800000;
  uStack_10cc = 0x7f800000;
  uStack_10c8 = 0x7f800000;
  uStack_10c4 = 0x7f800000;
  local_1000 = ZEXT1632(auVar9);
  local_1020 = ZEXT1632(auVar10);
  local_1040 = ZEXT1632(auVar11);
  local_1348 = ray;
  local_1340 = context;
LAB_00596fbb:
  lVar8 = 0;
  for (uVar23 = local_1358; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
    lVar8 = lVar8 + 1;
  }
  uVar15 = *(undefined4 *)(local_1120 + lVar8 * 4);
  auVar27._4_4_ = uVar15;
  auVar27._0_4_ = uVar15;
  auVar27._8_4_ = uVar15;
  auVar27._12_4_ = uVar15;
  auVar27._16_4_ = uVar15;
  auVar27._20_4_ = uVar15;
  auVar27._24_4_ = uVar15;
  auVar27._28_4_ = uVar15;
  auVar30 = vpcmpeqd_avx2(auVar27,local_1120);
  uVar15 = vmovmskps_avx(auVar30);
  pvVar16 = (vbool<8> *)CONCAT44((int)((ulong)lVar8 >> 0x20),uVar15);
  auVar13._4_4_ = fStack_105c;
  auVar13._0_4_ = local_1060;
  auVar13._8_4_ = fStack_1058;
  auVar13._12_4_ = fStack_1054;
  auVar13._16_4_ = fStack_1050;
  auVar13._20_4_ = fStack_104c;
  auVar13._24_4_ = fStack_1048;
  auVar13._28_4_ = uStack_1044;
  auVar48._8_4_ = 0x7f800000;
  auVar48._0_8_ = 0x7f8000007f800000;
  auVar48._12_4_ = 0x7f800000;
  auVar48._16_4_ = 0x7f800000;
  auVar48._20_4_ = 0x7f800000;
  auVar48._24_4_ = 0x7f800000;
  auVar48._28_4_ = 0x7f800000;
  auVar28 = vblendvps_avx(auVar48,auVar13,auVar30);
  local_1358 = ~(ulong)pvVar16 & local_1358;
  auVar27 = vshufps_avx(auVar28,auVar28,0xb1);
  auVar28 = vminps_avx(auVar28,auVar27);
  auVar27 = vshufpd_avx(auVar28,auVar28,5);
  auVar27 = vminps_avx(auVar28,auVar27);
  auVar44._4_4_ = fStack_107c;
  auVar44._0_4_ = local_1080;
  auVar44._8_4_ = fStack_1078;
  auVar44._12_4_ = fStack_1074;
  auVar44._16_4_ = fStack_1070;
  auVar44._20_4_ = fStack_106c;
  auVar44._24_4_ = fStack_1068;
  auVar44._28_4_ = uStack_1064;
  auVar28 = vblendvps_avx(auVar48,auVar44,auVar30);
  auVar9 = vminps_avx(auVar27._0_16_,auVar27._16_16_);
  auVar27 = vshufps_avx(auVar28,auVar28,0xb1);
  auVar28 = vminps_avx(auVar28,auVar27);
  auVar27 = vshufpd_avx(auVar28,auVar28,5);
  auVar28 = vminps_avx(auVar28,auVar27);
  auVar10 = vminps_avx(auVar28._0_16_,auVar28._16_16_);
  auVar10 = vunpcklps_avx(auVar9,auVar10);
  auVar3._4_4_ = fStack_109c;
  auVar3._0_4_ = local_10a0;
  auVar3._8_4_ = fStack_1098;
  auVar3._12_4_ = fStack_1094;
  auVar3._16_4_ = fStack_1090;
  auVar3._20_4_ = fStack_108c;
  auVar3._24_4_ = fStack_1088;
  auVar3._28_4_ = uStack_1084;
  auVar28 = vblendvps_avx(auVar48,auVar3,auVar30);
  auVar27 = vshufps_avx(auVar28,auVar28,0xb1);
  auVar28 = vminps_avx(auVar28,auVar27);
  auVar27 = vshufpd_avx(auVar28,auVar28,5);
  auVar28 = vminps_avx(auVar28,auVar27);
  auVar9 = vminps_avx(auVar28._0_16_,auVar28._16_16_);
  auVar11 = vinsertps_avx(auVar10,auVar9,0x28);
  auVar49._8_4_ = 0xff800000;
  auVar49._0_8_ = 0xff800000ff800000;
  auVar49._12_4_ = 0xff800000;
  auVar49._16_4_ = 0xff800000;
  auVar49._20_4_ = 0xff800000;
  auVar49._24_4_ = 0xff800000;
  auVar49._28_4_ = 0xff800000;
  auVar28 = vblendvps_avx(auVar49,auVar13,auVar30);
  auVar27 = vshufps_avx(auVar28,auVar28,0xb1);
  auVar28 = vmaxps_avx(auVar28,auVar27);
  auVar27 = vshufpd_avx(auVar28,auVar28,5);
  auVar28 = vmaxps_avx(auVar28,auVar27);
  auVar9 = vmaxps_avx(auVar28._0_16_,auVar28._16_16_);
  auVar28 = vblendvps_avx(auVar49,auVar44,auVar30);
  auVar27 = vshufps_avx(auVar28,auVar28,0xb1);
  auVar28 = vmaxps_avx(auVar28,auVar27);
  auVar27 = vshufpd_avx(auVar28,auVar28,5);
  auVar28 = vmaxps_avx(auVar28,auVar27);
  auVar10 = vmaxps_avx(auVar28._0_16_,auVar28._16_16_);
  auVar10 = vunpcklps_avx(auVar9,auVar10);
  auVar28 = vblendvps_avx(auVar49,auVar3,auVar30);
  auVar27 = vshufps_avx(auVar28,auVar28,0xb1);
  auVar28 = vmaxps_avx(auVar28,auVar27);
  auVar27 = vshufpd_avx(auVar28,auVar28,5);
  auVar28 = vmaxps_avx(auVar28,auVar27);
  auVar9 = vmaxps_avx(auVar28._0_16_,auVar28._16_16_);
  auVar28 = vblendvps_avx(auVar48,auVar54._0_32_,auVar30);
  auVar6 = vinsertps_avx(auVar10,auVar9,0x28);
  auVar27 = vshufps_avx(auVar28,auVar28,0xb1);
  auVar28 = vminps_avx(auVar28,auVar27);
  auVar27 = vshufpd_avx(auVar28,auVar28,5);
  auVar27 = vminps_avx(auVar28,auVar27);
  auVar28 = vblendvps_avx(auVar48,auVar55._0_32_,auVar30);
  auVar9 = vminps_avx(auVar27._0_16_,auVar27._16_16_);
  auVar27 = vshufps_avx(auVar28,auVar28,0xb1);
  auVar28 = vminps_avx(auVar28,auVar27);
  auVar27 = vshufpd_avx(auVar28,auVar28,5);
  auVar28 = vminps_avx(auVar28,auVar27);
  auVar10 = vminps_avx(auVar28._0_16_,auVar28._16_16_);
  auVar10 = vunpcklps_avx(auVar9,auVar10);
  auVar28 = vblendvps_avx(auVar48,auVar56._0_32_,auVar30);
  auVar27 = vshufps_avx(auVar28,auVar28,0xb1);
  auVar28 = vminps_avx(auVar28,auVar27);
  auVar27 = vshufpd_avx(auVar28,auVar28,5);
  auVar28 = vminps_avx(auVar28,auVar27);
  auVar9 = vminps_avx(auVar28._0_16_,auVar28._16_16_);
  auVar36 = vinsertps_avx(auVar10,auVar9,0x28);
  auVar28 = vblendvps_avx(auVar49,auVar54._0_32_,auVar30);
  auVar27 = vshufps_avx(auVar28,auVar28,0xb1);
  auVar28 = vmaxps_avx(auVar28,auVar27);
  auVar27 = vshufpd_avx(auVar28,auVar28,5);
  auVar28 = vmaxps_avx(auVar28,auVar27);
  auVar9 = vmaxps_avx(auVar28._0_16_,auVar28._16_16_);
  auVar28 = vblendvps_avx(auVar49,auVar55._0_32_,auVar30);
  auVar27 = vshufps_avx(auVar28,auVar28,0xb1);
  auVar28 = vmaxps_avx(auVar28,auVar27);
  auVar27 = vshufpd_avx(auVar28,auVar28,5);
  auVar28 = vmaxps_avx(auVar28,auVar27);
  auVar10 = vmaxps_avx(auVar28._0_16_,auVar28._16_16_);
  auVar10 = vunpcklps_avx(auVar9,auVar10);
  auVar28 = vblendvps_avx(auVar49,auVar56._0_32_,auVar30);
  auVar27 = vshufps_avx(auVar28,auVar28,0xb1);
  auVar28 = vmaxps_avx(auVar28,auVar27);
  auVar27 = vshufpd_avx(auVar28,auVar28,5);
  auVar28 = vmaxps_avx(auVar28,auVar27);
  auVar9 = vmaxps_avx(auVar28._0_16_,auVar28._16_16_);
  auVar28 = vblendvps_avx(auVar48,local_11a0,auVar30);
  auVar41 = vinsertps_avx(auVar10,auVar9,0x28);
  auVar27 = vshufps_avx(auVar28,auVar28,0xb1);
  auVar28 = vminps_avx(auVar28,auVar27);
  auVar27 = vshufpd_avx(auVar28,auVar28,5);
  auVar27 = vminps_avx(auVar28,auVar27);
  local_12e0 = vblendvps_avx(auVar49,local_10c0,auVar30);
  auVar28 = vshufps_avx(local_12e0,local_12e0,0xb1);
  auVar28 = vmaxps_avx(local_12e0,auVar28);
  auVar3 = vshufpd_avx(auVar28,auVar28,5);
  auVar5 = vcmpps_avx(auVar36,_DAT_01f7aa10,5);
  auVar9 = vblendvps_avx(auVar41,auVar36,auVar5);
  auVar10 = vblendvps_avx(auVar11,auVar6,auVar5);
  auVar28 = vmaxps_avx(auVar28,auVar3);
  auVar11 = vblendvps_avx(auVar6,auVar11,auVar5);
  local_11b0 = auVar9._0_4_;
  auVar6 = vmovshdup_avx(auVar9);
  local_1328 = (ulong)(auVar6._0_4_ < 0.0) << 4 | 0x20;
  auVar6 = vshufpd_avx(auVar9,auVar9,1);
  uVar24 = (ulong)(auVar6._0_4_ < 0.0) << 4 | 0x40;
  local_1330 = local_1328 ^ 0x10;
  auVar7 = vminps_avx(auVar27._0_16_,auVar27._16_16_);
  auVar6 = vmaxps_avx(auVar28._0_16_,auVar28._16_16_);
  auVar52 = ZEXT3264(CONCAT428(uStack_1164,
                               CONCAT424(fStack_1168,
                                         CONCAT420(fStack_116c,
                                                   CONCAT416(fStack_1170,
                                                             CONCAT412(fStack_1174,
                                                                       CONCAT48(fStack_1178,
                                                                                CONCAT44(fStack_117c
                                                                                         ,local_1180
                                                                                        ))))))));
  auVar51 = ZEXT3264(CONCAT428(uStack_1144,
                               CONCAT424(fStack_1148,
                                         CONCAT420(fStack_114c,
                                                   CONCAT416(fStack_1150,
                                                             CONCAT412(fStack_1154,
                                                                       CONCAT48(fStack_1158,
                                                                                CONCAT44(fStack_115c
                                                                                         ,local_1160
                                                                                        ))))))));
  auVar5 = vblendvps_avx(auVar36,auVar41,auVar5);
  auVar41._0_4_ = auVar10._0_4_ * local_11b0;
  auVar41._4_4_ = auVar10._4_4_ * auVar9._4_4_;
  auVar41._8_4_ = auVar10._8_4_ * auVar9._8_4_;
  auVar41._12_4_ = auVar10._12_4_ * auVar9._12_4_;
  auVar50 = ZEXT3264(CONCAT428(uStack_1124,
                               CONCAT424(fStack_1128,
                                         CONCAT420(fStack_112c,
                                                   CONCAT416(fStack_1130,
                                                             CONCAT412(fStack_1134,
                                                                       CONCAT48(fStack_1138,
                                                                                CONCAT44(fStack_113c
                                                                                         ,local_1140
                                                                                        ))))))));
  local_1210 = auVar5._0_4_;
  auVar36._0_4_ = auVar11._0_4_ * local_1210;
  auVar36._4_4_ = auVar11._4_4_ * auVar5._4_4_;
  auVar36._8_4_ = auVar11._8_4_ * auVar5._8_4_;
  auVar36._12_4_ = auVar11._12_4_ * auVar5._12_4_;
  uVar23 = (ulong)(local_11b0 < 0.0) << 4;
  uVar19 = uVar23 ^ 0x10;
  local_fa0 = *(ulong *)&local_1360[1].bounds.bounds0.lower.field_0;
  local_f98 = pvVar16;
  local_11c0 = (uint)auVar41._0_4_ ^ local_1290;
  uStack_11bc = (uint)auVar41._0_4_ ^ uStack_128c;
  uStack_11b8 = (uint)auVar41._0_4_ ^ uStack_1288;
  uStack_11b4 = (uint)auVar41._0_4_ ^ uStack_1284;
  local_11d0 = vshufps_avx(auVar9,auVar9,0x55);
  auVar10 = vshufps_avx(auVar41,auVar41,0x55);
  local_11e0._0_4_ = auVar10._0_4_ ^ local_1290;
  local_11e0._4_4_ = auVar10._4_4_ ^ uStack_128c;
  local_11e0._8_4_ = auVar10._8_4_ ^ uStack_1288;
  local_11e0._12_4_ = auVar10._12_4_ ^ uStack_1284;
  local_11f0 = vshufps_avx(auVar9,auVar9,0xaa);
  auVar9 = vshufps_avx(auVar41,auVar41,0xaa);
  local_1200 = auVar9._0_4_ ^ local_1290;
  uStack_11fc = auVar9._4_4_ ^ uStack_128c;
  uStack_11f8 = auVar9._8_4_ ^ uStack_1288;
  uStack_11f4 = auVar9._12_4_ ^ uStack_1284;
  local_1220 = (uint)auVar36._0_4_ ^ local_1290;
  uStack_121c = (uint)auVar36._0_4_ ^ uStack_128c;
  uStack_1218 = (uint)auVar36._0_4_ ^ uStack_1288;
  uStack_1214 = (uint)auVar36._0_4_ ^ uStack_1284;
  local_1230 = vshufps_avx(auVar5,auVar5,0x55);
  auVar9 = vshufps_avx(auVar36,auVar36,0x55);
  local_1240._0_4_ = auVar9._0_4_ ^ local_1290;
  local_1240._4_4_ = auVar9._4_4_ ^ uStack_128c;
  local_1240._8_4_ = auVar9._8_4_ ^ uStack_1288;
  local_1240._12_4_ = auVar9._12_4_ ^ uStack_1284;
  local_1250 = vshufps_avx(auVar5,auVar5,0xaa);
  auVar9 = vshufps_avx(auVar36,auVar36,0xaa);
  local_1260._0_4_ = auVar9._0_4_ ^ local_1290;
  local_1260._4_4_ = auVar9._4_4_ ^ uStack_128c;
  local_1260._8_4_ = auVar9._8_4_ ^ uStack_1288;
  local_1260._12_4_ = auVar9._12_4_ ^ uStack_1284;
  local_1270 = auVar7._0_4_;
  local_1280 = auVar6._0_4_;
  puVar17 = local_f90;
  auVar28._4_4_ = uStack_10dc;
  auVar28._0_4_ = local_10e0;
  auVar28._8_4_ = uStack_10d8;
  auVar28._12_4_ = uStack_10d4;
  auVar28._16_4_ = uStack_10d0;
  auVar28._20_4_ = uStack_10cc;
  auVar28._24_4_ = uStack_10c8;
  auVar28._28_4_ = uStack_10c4;
  local_fe0 = vblendvps_avx(auVar28,local_11a0,auVar30);
  auVar32 = ZEXT3264(auVar30);
  auVar57 = ZEXT3264(auVar57._0_32_);
  local_1350 = uVar23;
  uStack_127c = local_1280;
  uStack_1278 = local_1280;
  uStack_1274 = local_1280;
  uStack_126c = local_1270;
  uStack_1268 = local_1270;
  uStack_1264 = local_1270;
  fStack_120c = local_1210;
  fStack_1208 = local_1210;
  fStack_1204 = local_1210;
  fStack_11ac = local_11b0;
  fStack_11a8 = local_11b0;
  fStack_11a4 = local_11b0;
LAB_00597404:
  auVar30 = auVar57._0_32_;
  uVar15 = vmovmskps_avx(auVar30);
  pvVar16 = (vbool<8> *)~CONCAT44((int)((ulong)pvVar16 >> 0x20),uVar15);
  auVar28 = auVar32._0_32_;
  while (puVar1 = puVar17 + -2, puVar2 = puVar17 + -1, puVar17 = puVar1,
        (*puVar2 & (ulong)pvVar16) != 0) {
    uVar22 = *puVar1;
    uVar25 = uVar22;
    if ((uVar22 & 8) != 0) {
LAB_00597624:
      local_12c0._4_4_ = auVar57._4_4_ ^ auVar53._4_4_;
      local_12c0._0_4_ = auVar57._0_4_ ^ auVar53._0_4_;
      local_12c0._8_4_ = auVar57._8_4_ ^ auVar53._8_4_;
      local_12c0._12_4_ = auVar57._12_4_ ^ auVar53._12_4_;
      uStack_12b0 = auVar57._16_4_ ^ auVar53._16_4_;
      uStack_12ac = auVar57._20_4_ ^ auVar53._20_4_;
      uStack_12a8 = auVar57._24_4_ ^ auVar53._24_4_;
      uStack_12a4 = auVar57._28_4_ ^ auVar53._28_4_;
      pvVar16 = (vbool<8> *)((ulong)((uint)uVar22 & 0xf) - 8);
      local_1320 = auVar30;
      local_1300 = auVar28;
      if (pvVar16 == (vbool<8> *)0x0) goto LAB_0059771c;
      prim = (Primitive_conflict4 *)(uVar22 & 0xfffffffffffffff0);
      local_1370 = (vbool<8> *)0x1;
      local_1338 = pvVar16;
      goto LAB_0059765d;
    }
    while( true ) {
      auVar9._4_4_ = uStack_11bc;
      auVar9._0_4_ = local_11c0;
      auVar9._8_4_ = uStack_11b8;
      auVar9._12_4_ = uStack_11b4;
      auVar12._4_4_ = fStack_11ac;
      auVar12._0_4_ = local_11b0;
      auVar12._8_4_ = fStack_11a8;
      auVar12._12_4_ = fStack_11a4;
      auVar9 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar25 + 0x20 + uVar23),auVar9,auVar12);
      auVar10 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar25 + 0x20 + local_1328),local_11e0,
                                local_11d0);
      auVar9 = vpmaxsd_avx(auVar9,auVar10);
      auVar7._4_4_ = uStack_11fc;
      auVar7._0_4_ = local_1200;
      auVar7._8_4_ = uStack_11f8;
      auVar7._12_4_ = uStack_11f4;
      auVar10 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar25 + 0x20 + uVar24),auVar7,local_11f0);
      auVar11._4_4_ = uStack_126c;
      auVar11._0_4_ = local_1270;
      auVar11._8_4_ = uStack_1268;
      auVar11._12_4_ = uStack_1264;
      auVar10 = vpmaxsd_avx(auVar10,auVar11);
      auVar9 = vpmaxsd_avx(auVar9,auVar10);
      auVar10._4_4_ = uStack_121c;
      auVar10._0_4_ = local_1220;
      auVar10._8_4_ = uStack_1218;
      auVar10._12_4_ = uStack_1214;
      auVar6._4_4_ = fStack_120c;
      auVar6._0_4_ = local_1210;
      auVar6._8_4_ = fStack_1208;
      auVar6._12_4_ = fStack_1204;
      auVar10 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar25 + 0x20 + uVar19),auVar10,auVar6);
      auVar11 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar25 + 0x20 + local_1330),local_1240,
                                local_1230);
      auVar10 = vpminsd_avx(auVar10,auVar11);
      auVar11 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar25 + 0x20 + (uVar24 ^ 0x10)),local_1260,
                                local_1250);
      auVar5._4_4_ = uStack_127c;
      auVar5._0_4_ = local_1280;
      auVar5._8_4_ = uStack_1278;
      auVar5._12_4_ = uStack_1274;
      auVar11 = vpminsd_avx(auVar11,auVar5);
      auVar10 = vpminsd_avx(auVar10,auVar11);
      auVar9 = vcmpps_avx(auVar9,auVar10,2);
      uVar14 = vmovmskps_avx(auVar9);
      if (uVar14 == 0) break;
      uVar18 = (ulong)(uVar14 & 0xff);
      uVar20 = 0;
      uVar21 = 8;
      do {
        lVar8 = 0;
        for (uVar22 = uVar18; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
          lVar8 = lVar8 + 1;
        }
        uVar15 = *(undefined4 *)(uVar25 + 0x20 + lVar8 * 4);
        auVar29._4_4_ = uVar15;
        auVar29._0_4_ = uVar15;
        auVar29._8_4_ = uVar15;
        auVar29._12_4_ = uVar15;
        auVar29._16_4_ = uVar15;
        auVar29._20_4_ = uVar15;
        auVar29._24_4_ = uVar15;
        auVar29._28_4_ = uVar15;
        uVar15 = *(undefined4 *)(uVar25 + 0x40 + lVar8 * 4);
        auVar34._4_4_ = uVar15;
        auVar34._0_4_ = uVar15;
        auVar34._8_4_ = uVar15;
        auVar34._12_4_ = uVar15;
        auVar34._16_4_ = uVar15;
        auVar34._20_4_ = uVar15;
        auVar34._24_4_ = uVar15;
        auVar34._28_4_ = uVar15;
        auVar9 = vfmadd213ps_fma(auVar29,auVar54._0_32_,auVar50._0_32_);
        auVar10 = vfmadd213ps_fma(auVar34,auVar55._0_32_,auVar51._0_32_);
        uVar15 = *(undefined4 *)(uVar25 + 0x60 + lVar8 * 4);
        auVar39._4_4_ = uVar15;
        auVar39._0_4_ = uVar15;
        auVar39._8_4_ = uVar15;
        auVar39._12_4_ = uVar15;
        auVar39._16_4_ = uVar15;
        auVar39._20_4_ = uVar15;
        auVar39._24_4_ = uVar15;
        auVar39._28_4_ = uVar15;
        auVar11 = vfmadd213ps_fma(auVar39,auVar56._0_32_,auVar52._0_32_);
        uVar15 = *(undefined4 *)(uVar25 + 0x30 + lVar8 * 4);
        auVar40._4_4_ = uVar15;
        auVar40._0_4_ = uVar15;
        auVar40._8_4_ = uVar15;
        auVar40._12_4_ = uVar15;
        auVar40._16_4_ = uVar15;
        auVar40._20_4_ = uVar15;
        auVar40._24_4_ = uVar15;
        auVar40._28_4_ = uVar15;
        auVar5 = vfmadd213ps_fma(auVar40,auVar54._0_32_,auVar50._0_32_);
        uVar15 = *(undefined4 *)(uVar25 + 0x50 + lVar8 * 4);
        auVar45._4_4_ = uVar15;
        auVar45._0_4_ = uVar15;
        auVar45._8_4_ = uVar15;
        auVar45._12_4_ = uVar15;
        auVar45._16_4_ = uVar15;
        auVar45._20_4_ = uVar15;
        auVar45._24_4_ = uVar15;
        auVar45._28_4_ = uVar15;
        uVar15 = *(undefined4 *)(uVar25 + 0x70 + lVar8 * 4);
        auVar47._4_4_ = uVar15;
        auVar47._0_4_ = uVar15;
        auVar47._8_4_ = uVar15;
        auVar47._12_4_ = uVar15;
        auVar47._16_4_ = uVar15;
        auVar47._20_4_ = uVar15;
        auVar47._24_4_ = uVar15;
        auVar47._28_4_ = uVar15;
        auVar6 = vfmadd213ps_fma(auVar45,auVar55._0_32_,auVar51._0_32_);
        auVar36 = vfmadd213ps_fma(auVar47,auVar56._0_32_,auVar52._0_32_);
        auVar27 = vpminsd_avx2(ZEXT1632(auVar9),ZEXT1632(auVar5));
        auVar3 = vpminsd_avx2(ZEXT1632(auVar10),ZEXT1632(auVar6));
        auVar27 = vpmaxsd_avx2(auVar27,auVar3);
        auVar3 = vpminsd_avx2(ZEXT1632(auVar11),ZEXT1632(auVar36));
        auVar3 = vpmaxsd_avx2(auVar3,local_fe0);
        auVar27 = vpmaxsd_avx2(auVar27,auVar3);
        auVar3 = vpmaxsd_avx2(ZEXT1632(auVar9),ZEXT1632(auVar5));
        auVar38 = vpmaxsd_avx2(ZEXT1632(auVar10),ZEXT1632(auVar6));
        auVar38 = vpminsd_avx2(auVar3,auVar38);
        auVar3 = vpmaxsd_avx2(ZEXT1632(auVar11),ZEXT1632(auVar36));
        auVar3 = vpminsd_avx2(auVar3,local_12e0);
        auVar3 = vpminsd_avx2(auVar38,auVar3);
        auVar27 = vcmpps_avx(auVar27,auVar3,2);
        uVar22 = uVar21;
        if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar27 >> 0x7f,0) != '\0') ||
              (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar27 >> 0xbf,0) != '\0') ||
            (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar27[0x1f] < '\0') {
          uVar22 = *(ulong *)(uVar25 + lVar8 * 8);
          if (uVar21 != 8) {
            *puVar17 = uVar21;
            puVar17[1] = uVar20;
            puVar17 = puVar17 + 2;
          }
          uVar14 = vmovmskps_avx(auVar27);
          uVar20 = (ulong)uVar14;
        }
        uVar18 = uVar18 - 1 & uVar18;
        uVar21 = uVar22;
      } while (uVar18 != 0);
      if (uVar22 == 8) break;
      uVar25 = uVar22;
      if ((uVar22 & 8) != 0) {
        if (uVar20 != 0) goto LAB_00597624;
        auVar32 = ZEXT3264(auVar28);
        goto LAB_00597759;
      }
    }
    auVar32 = ZEXT3264(auVar28);
    if (puVar17 == &local_fa0) goto LAB_0059776f;
  }
  goto LAB_00597759;
  while( true ) {
    prim = prim + 1;
    pvVar16 = (vbool<8> *)((long)&local_1370->field_0 + 1);
    bVar26 = local_1338 <= local_1370;
    local_1370 = pvVar16;
    _local_12c0 = aVar4;
    if (bVar26) break;
LAB_0059765d:
    auVar53 = ZEXT1664(auVar53._0_16_);
    pvVar16 = InstanceArrayIntersectorK<8>::occluded
                        ((vbool<8> *)&local_fc0.field_1,(vbool<8> *)local_12c0,&local_1371,ray,
                         local_1340,prim);
    aVar4.v = (__m256)vandnps_avx(local_fc0.v,_local_12c0);
    auVar28 = (undefined1  [32])_local_12c0 & ~(undefined1  [32])local_fc0;
    ray = local_1348;
    if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar28 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar28 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar28 >> 0x7f,0) == '\0') &&
          (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar28 >> 0xbf,0) == '\0') &&
        (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar28[0x1f])
    break;
  }
  auVar28 = vpcmpeqd_avx2(auVar53._0_32_,auVar53._0_32_);
  auVar53 = ZEXT3264(auVar28);
  auVar30._0_4_ = auVar28._0_4_ ^ aVar4.i[0];
  auVar30._4_4_ = auVar28._4_4_ ^ aVar4.i[1];
  auVar30._8_4_ = auVar28._8_4_ ^ aVar4.i[2];
  auVar30._12_4_ = auVar28._12_4_ ^ aVar4.i[3];
  auVar30._16_4_ = auVar28._16_4_ ^ aVar4.i[4];
  auVar30._20_4_ = auVar28._20_4_ ^ aVar4.i[5];
  auVar30._24_4_ = auVar28._24_4_ ^ aVar4.i[6];
  auVar30._28_4_ = auVar28._28_4_ ^ aVar4.i[7];
  auVar54 = ZEXT3264(local_1000);
  auVar55 = ZEXT3264(local_1020);
  auVar56 = ZEXT3264(local_1040);
  auVar50 = ZEXT3264(CONCAT428(uStack_1124,
                               CONCAT424(fStack_1128,
                                         CONCAT420(fStack_112c,
                                                   CONCAT416(fStack_1130,
                                                             CONCAT412(fStack_1134,
                                                                       CONCAT48(fStack_1138,
                                                                                CONCAT44(fStack_113c
                                                                                         ,local_1140
                                                                                        ))))))));
  auVar51 = ZEXT3264(CONCAT428(uStack_1144,
                               CONCAT424(fStack_1148,
                                         CONCAT420(fStack_114c,
                                                   CONCAT416(fStack_1150,
                                                             CONCAT412(fStack_1154,
                                                                       CONCAT48(fStack_1158,
                                                                                CONCAT44(fStack_115c
                                                                                         ,local_1160
                                                                                        ))))))));
  auVar52 = ZEXT3264(CONCAT428(uStack_1164,
                               CONCAT424(fStack_1168,
                                         CONCAT420(fStack_116c,
                                                   CONCAT416(fStack_1170,
                                                             CONCAT412(fStack_1174,
                                                                       CONCAT48(fStack_1178,
                                                                                CONCAT44(fStack_117c
                                                                                         ,local_1180
                                                                                        ))))))));
  uVar23 = local_1350;
LAB_0059771c:
  auVar27 = vorps_avx(local_1320,auVar30);
  auVar57 = ZEXT3264(auVar27);
  auVar3 = local_1300 & ~auVar27;
  auVar28 = auVar30;
  if ((((((((auVar3 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar3 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar3 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar3 >> 0x7f,0) == '\0') &&
        (auVar3 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar3 >> 0xbf,0) == '\0') &&
      (auVar3 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar3[0x1f])
  goto LAB_0059776f;
  auVar28 = vandnps_avx(auVar27,local_1300);
  auVar31._8_4_ = 0xff800000;
  auVar31._0_8_ = 0xff800000ff800000;
  auVar31._12_4_ = 0xff800000;
  auVar31._16_4_ = 0xff800000;
  auVar31._20_4_ = 0xff800000;
  auVar31._24_4_ = 0xff800000;
  auVar31._28_4_ = 0xff800000;
  local_12e0 = vblendvps_avx(local_12e0,auVar31,auVar27);
  auVar32 = ZEXT3264(auVar28);
LAB_00597759:
  auVar28 = auVar32._0_32_;
  if (puVar17 == &local_fa0) goto LAB_0059776f;
  goto LAB_00597404;
LAB_0059776f:
  if (local_1358 == 0) {
    auVar28 = vpcmpeqd_avx2(auVar28,auVar28);
    auVar28 = vpcmpeqd_avx2(auVar28,(undefined1  [32])local_1100);
    auVar28 = vpand_avx2(auVar57._0_32_,auVar28);
    auVar35._8_4_ = 0xff800000;
    auVar35._0_8_ = 0xff800000ff800000;
    auVar35._12_4_ = 0xff800000;
    auVar35._16_4_ = 0xff800000;
    auVar35._20_4_ = 0xff800000;
    auVar35._24_4_ = 0xff800000;
    auVar35._28_4_ = 0xff800000;
    auVar28 = vmaskmovps_avx(auVar28,auVar35);
    *(undefined1 (*) [32])local_1368 = auVar28;
    return;
  }
  goto LAB_00596fbb;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occludedCoherent(vint<K>* __restrict__ valid_i,
                                                                                                      Accel::Intersectors* __restrict__ This,
                                                                                                      RayK<K>& __restrict__ ray,
                                                                                                      RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid,ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      vbool<K> terminated = !valid;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      do
      {
        const size_t valid_index = bsf(valid_bits);
        vbool<K> octant_valid = octant[valid_index] == octant;
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar,  vfloat<K>(neg_inf));

        Frustum<robust> frustum;
        frustum.template init<K>(octant_valid, tray.org, tray.rdir, tray.tnear, tray.tfar, N);

        StackItemMaskT<NodeRef> stack[stackSizeSingle];  // stack of nodes
        StackItemMaskT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
        stack[0].ptr  = bvh->root;
        stack[0].mask = movemask(octant_valid);

        while (1) pop:
        {
          /* pop next node from stack */
          if (unlikely(stackPtr == stack)) break;

          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* cull node of active rays have already been terminated */
          size_t m_active = (size_t)stackPtr->mask & (~(size_t)movemask(terminated));

          if (unlikely(m_active == 0)) continue;

          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            //STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const AABBNode* __restrict__ const node = nodeRef.getAABBNode();

            vfloat<N> fmin;
            size_t m_frustum_node = intersectNodeFrustum<N>(node, frustum, fmin);

            if (unlikely(!m_frustum_node)) goto pop;
            cur = BVH::emptyNode;
            m_active = 0;

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[popcnt(m_frustum_node)], 1, 1, 1);
#endif
            //size_t num_child_hits = 0;
            do {
              const size_t i = bscf(m_frustum_node);
              vfloat<K> lnearP;
              vbool<K> lhit = false; // motion blur is not supported, so the initial value will be ignored
              STAT3(normal.trav_nodes, 1, 1, 1);
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              if (likely(any(lhit)))
              {                                
                const NodeRef child = node->child(i);
                assert(child != BVH::emptyNode);
                BVHN<N>::prefetch(child);
                if (likely(cur != BVH::emptyNode)) {
                  //num_child_hits++;
                  stackPtr->ptr  = cur;
                  stackPtr->mask = m_active;
                  stackPtr++;
                }
                cur = child;
                m_active = movemask(lhit);
              }
            } while(m_frustum_node);

            if (unlikely(cur == BVH::emptyNode)) goto pop;
          }

          /* intersect leaf */
          assert(cur != BVH::invalidNode);
          assert(cur != BVH::emptyNode);
#if defined(__AVX__)
          STAT3(normal.trav_leaves, 1, popcnt(m_active), K);
#endif
          if (unlikely(!m_active)) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
          octant_valid &= !terminated;
          if (unlikely(none(octant_valid))) break;
          tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

          if (unlikely(lazy_node)) {
            stackPtr->ptr  = lazy_node;
            stackPtr->mask = movemask(octant_valid);
            stackPtr++;
          }
        }
      } while(valid_bits);

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }